

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestCase.cpp
# Opt level: O2

void __thiscall
deqp::egl::EglTestContext::EglTestContext
          (EglTestContext *this,TestContext *testCtx,NativeDisplayFactory *displayFactory)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  this->m_testCtx = testCtx;
  this->m_nativeDisplayFactory = displayFactory;
  iVar1 = (*(displayFactory->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[3])
                    (displayFactory,0);
  (this->m_nativeDisplay).
  super_UniqueBase<eglu::NativeDisplay,_de::DefaultDeleter<eglu::NativeDisplay>_>.m_data.ptr =
       (NativeDisplay *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*testCtx->m_platform->_vptr_Platform[4])();
  eglu::GLLibraryCache::GLLibraryCache
            (&this->m_glLibraryCache,(Platform *)CONCAT44(extraout_var_00,iVar1),testCtx->m_cmdLine)
  ;
  return;
}

Assistant:

EglTestContext::EglTestContext (tcu::TestContext& testCtx, const eglu::NativeDisplayFactory& displayFactory)
	: m_testCtx					(testCtx)
	, m_nativeDisplayFactory	(displayFactory)
	, m_nativeDisplay			(m_nativeDisplayFactory.createDisplay())
	, m_glLibraryCache			(testCtx.getPlatform().getEGLPlatform(), testCtx.getCommandLine())
{
}